

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O2

void __thiscall Wasm::WasmSignature::SetResult(WasmSignature *this,Local type,uint32 index)

{
  WasmCompilationException *this_00;
  
  if (index < this->m_resultsCount) {
    (this->m_results).ptr[index] = type;
    return;
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_00,L"Result %u out of range (max %u)",(ulong)index,(ulong)this->m_resultsCount);
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmSignature::SetResult(Local type, uint32 index)
{
    if (index >= GetResultCount())
    {
        throw WasmCompilationException(_u("Result %u out of range (max %u)"), index, GetResultCount());
    }
    m_results[index] = type;
}